

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdlib.cpp
# Opt level: O0

FString ExtractFilePath(char *path)

{
  char *pcVar1;
  bool bVar2;
  size_t sVar3;
  char *in_RSI;
  byte local_39;
  char *local_20;
  char *src;
  char *path_local;
  
  sVar3 = strlen(in_RSI);
  pcVar1 = in_RSI + sVar3;
  do {
    local_20 = pcVar1 + -1;
    local_39 = 0;
    if (local_20 != in_RSI) {
      bVar2 = IsSeperator((int)pcVar1[-2]);
      local_39 = bVar2 ^ 0xff;
    }
    pcVar1 = local_20;
  } while ((local_39 & 1) != 0);
  FString::FString((FString *)path,in_RSI,(long)local_20 - (long)in_RSI);
  return (FString)path;
}

Assistant:

FString ExtractFilePath (const char *path)
{
	const char *src;

	src = path + strlen(path) - 1;

//
// back up until a \ or the start
//
	while (src != path && !IsSeperator(*(src-1)))
		src--;

	return FString(path, src - path);
}